

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrMultisamplePixelBufferAccess.cpp
# Opt level: O0

void rr::resolveMultisampleBuffer(PixelBufferAccess *dst,MultisampleConstPixelBufferAccess *src)

{
  ChannelOrder CVar1;
  ConstPixelBufferAccess *this;
  TextureFormat *pTVar2;
  MultisampleConstPixelBufferAccess *src_local;
  PixelBufferAccess *dst_local;
  
  this = MultisampleConstPixelBufferAccess::raw(src);
  pTVar2 = tcu::ConstPixelBufferAccess::getFormat(this);
  CVar1 = pTVar2->order;
  if (CVar1 == D) {
    resolveMultisampleDepthBuffer(dst,src);
  }
  else if (CVar1 == S) {
    resolveMultisampleStencilBuffer(dst,src);
  }
  else if (CVar1 == DS) {
    resolveMultisampleDepthBuffer(dst,src);
    resolveMultisampleStencilBuffer(dst,src);
  }
  else {
    resolveMultisampleColorBuffer(dst,src);
  }
  return;
}

Assistant:

void resolveMultisampleBuffer (const tcu::PixelBufferAccess& dst, const MultisampleConstPixelBufferAccess& src)
{
	switch (src.raw().getFormat().order)
	{
		case tcu::TextureFormat::D:
			resolveMultisampleDepthBuffer(dst, src);
			return;

		case tcu::TextureFormat::S:
			resolveMultisampleStencilBuffer(dst, src);
			return;

		case tcu::TextureFormat::DS:
			resolveMultisampleDepthBuffer(dst, src);
			resolveMultisampleStencilBuffer(dst, src);
			return;

		default:
			resolveMultisampleColorBuffer(dst, src);
			return;
	}
}